

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O2

double __thiscall HEkk::computeDualSteepestEdgeWeight(HEkk *this,HighsInt iRow,HVector *row_ep)

{
  double dVar1;
  
  HVectorBase<double>::clear(row_ep);
  row_ep->count = 1;
  *(row_ep->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
   _M_start = iRow;
  (row_ep->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[iRow] = 1.0;
  row_ep->packFlag = false;
  HSimplexNla::btranInScaledSpace
            (&this->simplex_nla_,row_ep,(this->info_).row_ep_density,
             (this->analysis_).pointer_serial_factor_clocks);
  updateOperationResultDensity
            (this,(double)row_ep->count / (double)(this->lp_).num_row_,&(this->info_).row_ep_density
            );
  dVar1 = HVectorBase<double>::norm2(row_ep);
  return dVar1;
}

Assistant:

double HEkk::computeDualSteepestEdgeWeight(const HighsInt iRow,
                                           HVector& row_ep) {
  row_ep.clear();
  row_ep.count = 1;
  row_ep.index[0] = iRow;
  row_ep.array[iRow] = 1;
  row_ep.packFlag = false;
  simplex_nla_.btranInScaledSpace(row_ep, info_.row_ep_density,
                                  analysis_.pointer_serial_factor_clocks);
  const double local_row_ep_density = (1.0 * row_ep.count) / lp_.num_row_;
  updateOperationResultDensity(local_row_ep_density, info_.row_ep_density);
  return row_ep.norm2();
}